

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprsimg.cpp
# Opt level: O3

void __thiscall CTcParser::build_dictionaries(CTcParser *this)

{
  CTcDictEntry *dict;
  CVmHashEntry *pCVar1;
  
  CTcPrsSymtab::enum_entries(this->global_symtab_,enum_sym_dict,this);
  for (pCVar1 = (CVmHashEntry *)this->anon_obj_head_; pCVar1 != (CVmHashEntry *)0x0;
      pCVar1 = pCVar1->nxt_) {
    (*(((CTcSymObjBase *)&pCVar1->_vptr_CVmHashEntry)->super_CTcSymbol).super_CTcSymbolBase.
      super_CVmHashEntryCS.super_CVmHashEntry._vptr_CVmHashEntry[0x11])(pCVar1);
  }
  for (dict = this->dict_head_; dict != (CTcDictEntry *)0x0; dict = dict->nxt_) {
    CTcGenTarg::gen_code_for_dict(G_cg,dict);
  }
  return;
}

Assistant:

void CTcParser::build_dictionaries()
{
    CTcDictEntry *dict;
    CTcSymObj *sym;
    
    /* 
     *   enumerate our symbols to insert dictionary words - this will
     *   populate each dictionary's hash table with a complete list of the
     *   words and object associations for the dictionary 
     */
    get_global_symtab()->enum_entries(&enum_sym_dict, this);

    /* do the same for the anonymous objects */
    for (sym = anon_obj_head_ ; sym != 0 ; sym = (CTcSymObj *)sym->nxt_)
        sym->build_dictionary();

    /* generate the object stream for each dictionary */
    for (dict = dict_head_ ; dict != 0 ; dict = dict->get_next())
    {
        /* generate the code (static data, actually) for this dictionary */
        G_cg->gen_code_for_dict(dict);
    }
}